

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManMerge(If_DsdMan_t *p,If_DsdMan_t *pNew)

{
  uint *puVar1;
  Vec_Mem_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  word Fill;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  word *pTruth;
  int iVar18;
  int pFanins [12];
  int local_68 [14];
  
  if (p->nVars < pNew->nVars) {
    pcVar17 = "The number of variables should be the same or smaller.";
  }
  else {
    if (p->LutSize == pNew->LutSize) {
      if (p->nTtBits != pNew->nTtBits) {
        __assert_fail("p->nTtBits == pNew->nTtBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c1,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      if (p->nConfigWords != pNew->nConfigWords) {
        __assert_fail("p->nConfigWords == pNew->nConfigWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c2,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      iVar10 = (p->vObjs).nSize;
      lVar7 = (long)iVar10;
      iVar9 = 0;
      iVar11 = 0;
      if (0 < lVar7) {
        lVar14 = 0;
        do {
          if ((*(byte *)((long)(p->vObjs).pArray[lVar14] + 5) & 1) != 0) {
            iVar11 = 1;
            goto LAB_00423782;
          }
          lVar14 = lVar14 + 1;
        } while (lVar7 != lVar14);
        iVar11 = 0;
      }
LAB_00423782:
      iVar18 = (pNew->vObjs).nSize;
      lVar14 = (long)iVar18;
      if (0 < lVar14) {
        lVar15 = 0;
        do {
          if ((*(byte *)((long)(pNew->vObjs).pArray[lVar15] + 5) & 1) != 0) {
            iVar9 = 1;
            goto LAB_004237ac;
          }
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
        iVar9 = 0;
      }
LAB_004237ac:
      if (iVar11 != iVar9) {
        pcVar17 = "no ";
        pcVar16 = "no ";
        if (0 < iVar10) {
          lVar15 = 0;
          pcVar16 = "";
          do {
            if ((*(byte *)((long)(p->vObjs).pArray[lVar15] + 5) & 1) != 0) goto LAB_004237e1;
            lVar15 = lVar15 + 1;
          } while (lVar7 != lVar15);
          pcVar16 = "no ";
        }
LAB_004237e1:
        if (0 < iVar18) {
          lVar7 = 0;
          do {
            if ((*(byte *)((long)(pNew->vObjs).pArray[lVar7] + 5) & 1) != 0) {
              pcVar17 = "";
              break;
            }
            lVar7 = lVar7 + 1;
          } while (lVar14 != lVar7);
        }
        printf("Warning! Old manager has %smarks while new manager has %smarks.\n",pcVar16,pcVar17);
        iVar18 = (pNew->vObjs).nSize;
      }
      p_00 = (Vec_Int_t *)malloc(0x10);
      iVar10 = 0x10;
      if (0xe < iVar18 - 1U) {
        iVar10 = iVar18;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar10;
      if (iVar10 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar10 << 2);
      }
      p_00->pArray = piVar8;
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,1);
      if ((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
        Vec_WrdFillExtra(p->vConfigs,((pNew->vObjs).nSize + (p->vObjs).nSize) * p->nConfigWords,Fill
                        );
      }
      iVar10 = (pNew->vObjs).nSize;
      if (2 < iVar10) {
        lVar7 = 2;
        do {
          piVar8 = (int *)(pNew->vObjs).pArray[lVar7];
          uVar6 = piVar8[1];
          uVar5 = uVar6 >> 0x1b;
          if (0x7ffffff < uVar6) {
            uVar12 = 0;
            do {
              uVar13 = piVar8[uVar12 + 2];
              if (uVar13 == 0) break;
              if ((int)uVar13 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x134,"int Abc_Lit2LitV(int *, int)");
              }
              if (p_00->pArray[uVar13 >> 1] < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_68[uVar12] = (uVar13 & 1) + p_00->pArray[uVar13 >> 1] * 2;
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          uVar13 = uVar6 & 7;
          if (uVar13 == 6) {
            if (uVar6 < 0x18000000) {
LAB_00423ad5:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            iVar10 = *piVar8;
            if (((long)iVar10 < 0) || ((pNew->vTruths).nSize <= iVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = (pNew->vTruths).pArray[iVar10];
            if (((int)uVar6 < 0) || (pVVar2 = pNew->vTtMem[uVar5], pVVar2->nEntries <= (int)uVar6))
            goto LAB_00423ad5;
            pTruth = pVVar2->ppPages[uVar6 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                     (long)(int)(pVVar2->PageMask & uVar6) * (long)pVVar2->nEntrySize;
            uVar13 = 6;
          }
          else {
            pTruth = (word *)0x0;
          }
          uVar6 = If_DsdObjFindOrAdd(p,uVar13,local_68,uVar5,pTruth);
          if ((*(byte *)((long)piVar8 + 5) & 1) != 0) {
            if (((int)uVar6 < 0) || ((p->vObjs).nSize <= (int)uVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)(p->vObjs).pArray[uVar6] + 4);
            *puVar1 = *puVar1 | 0x100;
          }
          pVVar3 = p->vConfigs;
          if ((pVVar3 != (Vec_Wrd_t *)0x0) && (pVVar4 = pNew->vConfigs, pVVar4 != (Vec_Wrd_t *)0x0))
          {
            iVar10 = p->nConfigWords;
            uVar5 = (int)lVar7 * iVar10;
            if ((int)uVar5 < pVVar4->nSize) {
              if ((((int)uVar5 < 0) || (uVar13 = iVar10 * uVar6, (int)uVar13 < 0)) ||
                 (pVVar3->nSize <= (int)uVar13)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              memcpy(pVVar3->pArray + uVar13,pVVar4->pArray + uVar5,(long)iVar10 << 3);
            }
          }
          Vec_IntPush(p_00,uVar6);
          lVar7 = lVar7 + 1;
          iVar10 = (pNew->vObjs).nSize;
        } while (lVar7 < iVar10);
      }
      if (p_00->nSize != iVar10) {
        __assert_fail("Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4db,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      pVVar3 = p->vConfigs;
      if ((pVVar3 != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
        iVar10 = (p->vObjs).nSize * p->nConfigWords;
        if (pVVar3->nSize < iVar10) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
        }
        pVVar3->nSize = iVar10;
      }
      return;
    }
    pcVar17 = "LUT size should be the same.";
  }
  puts(pcVar17);
  return;
}

Assistant:

void If_DsdManMerge( If_DsdMan_t * p, If_DsdMan_t * pNew )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int pFanins[DAU_MAX_VAR];
    int i, k, iFanin, Id;
    if ( p->nVars < pNew->nVars )
    {
        printf( "The number of variables should be the same or smaller.\n" );
        return;
    }
    if ( p->LutSize != pNew->LutSize )
    {
        printf( "LUT size should be the same.\n" );
        return;
    }
    assert( p->nTtBits == pNew->nTtBits );
    assert( p->nConfigWords == pNew->nConfigWords );
    if ( If_DsdManHasMarks(p) != If_DsdManHasMarks(pNew) )
        printf( "Warning! Old manager has %smarks while new manager has %smarks.\n", 
            If_DsdManHasMarks(p) ? "" : "no ", If_DsdManHasMarks(pNew) ? "" : "no " );
    vMap = Vec_IntAlloc( Vec_PtrSize(&pNew->vObjs) );
    Vec_IntPush( vMap, 0 );
    Vec_IntPush( vMap, 1 );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * (Vec_PtrSize(&p->vObjs) + Vec_PtrSize(&pNew->vObjs)), 0 );
    If_DsdVecForEachNode( &pNew->vObjs, pObj, i )
    {
        If_DsdObjForEachFaninLit( &pNew->vObjs, pObj, iFanin, k )
            pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
        Id = If_DsdObjFindOrAdd( p, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(pNew, pObj) : NULL );
        if ( pObj->fMark )
            If_DsdVecObjSetMark( &p->vObjs, Id );
        if ( p->vConfigs && pNew->vConfigs && p->nConfigWords * i < Vec_WrdSize(pNew->vConfigs) )
        {
            //Vec_WrdFillExtra( p->vConfigs, Id, Vec_WrdEntry(pNew->vConfigs, i) );
            word * pConfigNew = Vec_WrdEntryP(pNew->vConfigs, p->nConfigWords * i);
            word * pConfigOld = Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Id);
            memcpy( pConfigOld, pConfigNew, sizeof(word) * p->nConfigWords );
        }
        Vec_IntPush( vMap, Id );
    }
    assert( Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs) );
    Vec_IntFree( vMap );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdShrink( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs) );
}